

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall PDA::Transducer::Generator::writeGlobalFunctions(Generator *this,wostream *stream)

{
  pointer pIVar1;
  long *plVar2;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *pvVar3;
  wostream *pwVar4;
  size_t in_RCX;
  pointer pIVar5;
  wstring local_50;
  
  pvVar3 = Tokenizer::identifiers(this->m_tokenizer);
  pIVar5 = (pvVar3->
           super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pvVar3->
           super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar5 != pIVar1) {
    do {
      if (pIVar5->type == Function) {
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(stream,L".globl ",7);
        Utils::Misc::toBase64_abi_cxx11_
                  (&local_50,(Misc *)(pIVar5->decoratedName)._M_dataplus._M_p,
                   (uchar *)((pIVar5->decoratedName)._M_string_length << 2),in_RCX);
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
        plVar2 = *(long **)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xf0);
        if (plVar2 == (long *)0x0) {
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar4);
        std::wostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != pIVar1);
  }
  return;
}

Assistant:

void Generator::writeGlobalFunctions(std::wostream &stream)
{
    for(const Identifier &id : m_tokenizer.identifiers())
    {
        if (id.type == Identifier::Type::Function)
        {
            stream << L".globl " << hash(id.decoratedName) << std::endl;
        }
    }
}